

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O1

void rename_var(VarId *id,BasicBlock *b,
               map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
               *nodes,map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      *dom_tree)

{
  uint32_t *__v;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *__v_00;
  __index_type _Var1;
  uint32_t uVar2;
  element_type *peVar3;
  element_type *peVar4;
  BasicBlock *b_00;
  int iVar5;
  pointer pvVar6;
  variant_alternative_t<0UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar7;
  variant_alternative_t<1UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar8;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar9;
  variant_alternative_t<0UL,_variant<VarId,_basic_string<char>_>_> *pvVar10;
  pointer ppBVar11;
  ulong uVar12;
  _Rb_tree_header *p_Var13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  long lVar18;
  _func_int **pp_Var19;
  ulong uVar20;
  long lVar21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var22;
  ulong uVar23;
  VarId xv;
  VarId local_1b0;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  *local_1a0;
  uint32_t local_194;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_190;
  BasicBlock *local_188;
  VarId local_180;
  VarId local_170;
  undefined **local_160;
  uint32_t local_158;
  VarId local_150;
  undefined **local_140;
  uint32_t local_138;
  VarId local_130;
  undefined **local_120;
  uint32_t local_118;
  VarId local_110;
  undefined **local_100;
  uint32_t local_f8;
  VarId local_f0;
  undefined **local_e0;
  uint32_t local_d8;
  VarId local_d0;
  undefined **local_c0;
  uint32_t local_b8;
  VarId local_b0;
  undefined **local_a0;
  uint32_t local_98;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  local_60;
  
  local_194 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].id;
  pvVar6 = (b->inst).
           super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1a0 = &nodes->_M_t;
  local_190 = &dom_tree->_M_t;
  if ((b->inst).
      super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar6) {
    uVar20 = 0;
    do {
      __v_00 = pvVar6 + uVar20;
      _Var1 = (__v_00->
              super__Variant_base<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              ).
              super__Move_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Copy_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Move_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Copy_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Variant_storage_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              ._M_index;
      if (_Var1 == '\x01') {
        pvVar8 = std::
                 get<1ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                           (__v_00);
        peVar4 = (pvVar8->super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        p_Var22 = (pvVar8->
                  super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
          }
        }
        if (((peVar4->kind - Return < 2) &&
            ((peVar4->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
             super__Optional_payload_base<mir::inst::VarId>._M_engaged == true)) &&
           ((peVar4->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
            super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id == id->id)) {
          (peVar4->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
          super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id =
               V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].id;
        }
LAB_001959de:
        if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
        }
      }
      else if (_Var1 == '\0') {
        pvVar7 = std::
                 get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                           (__v_00);
        peVar3 = (pvVar7->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var22 = (pvVar7->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
          }
        }
        iVar5 = (*(peVar3->super_Displayable)._vptr_Displayable[1])(peVar3);
        if (iVar5 == 0) {
          if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
            }
          }
          if (*(char *)&peVar3[2].super_Displayable._vptr_Displayable == '\x01') {
            pvVar9 = std::get<1ul,int,mir::inst::VarId>
                               ((variant<int,_mir::inst::VarId> *)&peVar3[1].dest);
            if (pvVar9->id == id->id) {
              uVar2 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].id;
              peVar3[1].dest.super_Displayable._vptr_Displayable =
                   (_func_int **)&PTR_display_001ee058;
              peVar3[1].dest.id = uVar2;
              *(undefined1 *)&peVar3[2].super_Displayable._vptr_Displayable = 1;
              std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)&peVar3[1].dest);
            }
          }
          if ((peVar3->dest).id == id->id) {
            local_a0 = &PTR_display_001ee058;
            local_98 = id->id;
            rename((char *)&local_1b0,(char *)&local_a0);
            (peVar3->dest).id = local_1b0.id;
            local_b0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
            local_b0.id = local_1b0.id;
            push(&local_b0);
          }
        }
        else {
          iVar5 = (*(peVar3->super_Displayable)._vptr_Displayable[1])(peVar3);
          if (iVar5 == 6) {
            if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
              }
            }
            pp_Var19 = peVar3[2].dest.super_Displayable._vptr_Displayable;
            if (*(_func_int ***)&peVar3[2].dest.id != pp_Var19) {
              lVar18 = 8;
              lVar21 = 0x18;
              uVar23 = 0;
              do {
                if ((*(char *)((long)pp_Var19 + lVar21) == '\x01') &&
                   (pvVar9 = std::get<1ul,int,mir::inst::VarId>
                                       ((variant<int,_mir::inst::VarId> *)((long)pp_Var19 + lVar18))
                   , pvVar9->id == id->id)) {
                  pp_Var19 = peVar3[2].dest.super_Displayable._vptr_Displayable;
                  uVar2 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].id;
                  *(undefined ***)((long)pp_Var19 + lVar18) = &PTR_display_001ee058;
                  *(uint32_t *)((long)pp_Var19 + lVar18 + 8) = uVar2;
                  *(undefined1 *)((long)pp_Var19 + lVar18 + 0x10) = 1;
                  std::get<1ul,int,mir::inst::VarId>
                            ((variant<int,_mir::inst::VarId> *)((long)pp_Var19 + lVar18));
                }
                uVar23 = uVar23 + 1;
                pp_Var19 = peVar3[2].dest.super_Displayable._vptr_Displayable;
                lVar18 = lVar18 + 0x20;
                lVar21 = lVar21 + 0x20;
              } while (uVar23 < (ulong)(*(long *)&peVar3[2].dest.id - (long)pp_Var19 >> 5));
            }
            if ((peVar3->dest).id == id->id) {
              local_c0 = &PTR_display_001ee058;
              local_b8 = id->id;
              rename((char *)&local_1b0,(char *)&local_c0);
              (peVar3->dest).id = local_1b0.id;
              local_d0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
              local_d0.id = local_1b0.id;
              push(&local_d0);
            }
          }
          else {
            iVar5 = (*(peVar3->super_Displayable)._vptr_Displayable[1])(peVar3);
            if (iVar5 == 1) {
              if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                }
              }
              if (*(char *)&peVar3[2].super_Displayable._vptr_Displayable == '\x01') {
                pvVar9 = std::get<1ul,int,mir::inst::VarId>
                                   ((variant<int,_mir::inst::VarId> *)&peVar3[1].dest);
                if (pvVar9->id == id->id) {
                  uVar2 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].id;
                  peVar3[1].dest.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001ee058;
                  peVar3[1].dest.id = uVar2;
                  *(undefined1 *)&peVar3[2].super_Displayable._vptr_Displayable = 1;
                  std::get<1ul,int,mir::inst::VarId>
                            ((variant<int,_mir::inst::VarId> *)&peVar3[1].dest);
                }
              }
              if (*(char *)&peVar3[3].dest.super_Displayable._vptr_Displayable == '\x01') {
                __v = &peVar3[2].dest.id;
                pvVar9 = std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)__v);
                if (pvVar9->id == id->id) {
                  uVar2 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].id;
                  *(undefined ***)&peVar3[2].dest.id = &PTR_display_001ee058;
                  *(uint32_t *)&peVar3[3].super_Displayable._vptr_Displayable = uVar2;
                  *(undefined1 *)&peVar3[3].dest.super_Displayable._vptr_Displayable = 1;
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)__v);
                }
              }
              if ((peVar3->dest).id == id->id) {
                local_e0 = &PTR_display_001ee058;
                local_d8 = id->id;
                rename((char *)&local_1b0,(char *)&local_e0);
                (peVar3->dest).id = local_1b0.id;
                local_f0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
                local_f0.id = local_1b0.id;
                push(&local_f0);
              }
            }
            else {
              iVar5 = (*(peVar3->super_Displayable)._vptr_Displayable[1])(peVar3);
              if (iVar5 == 3) {
                if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                  }
                }
                if (*(char *)&peVar3[2].super_Displayable._vptr_Displayable == '\x01') {
                  pvVar9 = std::get<1ul,int,mir::inst::VarId>
                                     ((variant<int,_mir::inst::VarId> *)&peVar3[1].dest);
                  if (pvVar9->id == id->id) {
                    uVar2 = V.
                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1].id;
                    peVar3[1].dest.super_Displayable._vptr_Displayable =
                         (_func_int **)&PTR_display_001ee058;
                    peVar3[1].dest.id = uVar2;
                    *(undefined1 *)&peVar3[2].super_Displayable._vptr_Displayable = 1;
                    std::get<1ul,int,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)&peVar3[1].dest);
                  }
                }
                if ((peVar3->dest).id == id->id) {
                  local_100 = &PTR_display_001ee058;
                  local_f8 = id->id;
                  rename((char *)&local_1b0,(char *)&local_100);
                  (peVar3->dest).id = local_1b0.id;
                  local_110.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001ee058;
                  local_110.id = local_1b0.id;
                  push(&local_110);
                }
              }
              else {
                iVar5 = (*(peVar3->super_Displayable)._vptr_Displayable[1])(peVar3);
                if (iVar5 == 4) {
                  if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                    }
                  }
                  if (*(char *)&peVar3[2].super_Displayable._vptr_Displayable == '\x01') {
                    pvVar9 = std::get<1ul,int,mir::inst::VarId>
                                       ((variant<int,_mir::inst::VarId> *)&peVar3[1].dest);
                    if (pvVar9->id == id->id) {
                      uVar2 = V.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].id;
                      peVar3[1].dest.super_Displayable._vptr_Displayable =
                           (_func_int **)&PTR_display_001ee058;
                      peVar3[1].dest.id = uVar2;
                      *(undefined1 *)&peVar3[2].super_Displayable._vptr_Displayable = 1;
                      std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)&peVar3[1].dest);
                    }
                  }
                  if ((peVar3->dest).id == id->id) {
                    (peVar3->dest).id =
                         V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                         _M_impl.super__Vector_impl_data._M_finish[-1].id;
                  }
                }
                else {
                  iVar5 = (*(peVar3->super_Displayable)._vptr_Displayable[1])(peVar3);
                  if (iVar5 == 5) {
                    if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                      }
                    }
                    if ((char)peVar3[2].dest.id == '\x01') {
                      pvVar9 = std::get<1ul,int,mir::inst::VarId>
                                         ((variant<int,_mir::inst::VarId> *)(peVar3 + 2));
                      if (pvVar9->id == id->id) {
                        uVar2 = V.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].id;
                        peVar3[2].super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001ee058;
                        *(uint32_t *)&peVar3[2].dest.super_Displayable._vptr_Displayable = uVar2;
                        *(undefined1 *)&peVar3[2].dest.id = 1;
                        std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)(peVar3 + 2));
                      }
                    }
                    if (*(uint32_t *)&peVar3[1].dest.super_Displayable._vptr_Displayable == id->id)
                    {
                      *(uint32_t *)&peVar3[1].dest.super_Displayable._vptr_Displayable =
                           V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].id;
                    }
                    if ((peVar3->dest).id == id->id) {
                      local_120 = &PTR_display_001ee058;
                      local_118 = id->id;
                      rename((char *)&local_1b0,(char *)&local_120);
                      (peVar3->dest).id = local_1b0.id;
                      local_130.super_Displayable._vptr_Displayable =
                           (_func_int **)&PTR_display_001ee058;
                      local_130.id = local_1b0.id;
                      push(&local_130);
                    }
                  }
                  else {
                    iVar5 = (*(peVar3->super_Displayable)._vptr_Displayable[1])(peVar3);
                    if (iVar5 == 2) {
                      if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                        }
                      }
                      if (*(char *)&peVar3[2].dest.super_Displayable._vptr_Displayable == '\0') {
                        pvVar10 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                            ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)(peVar3 + 1));
                        if (pvVar10->id == id->id) {
                          local_1b0.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001ee058;
                          local_1b0.id = V.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_finish[-1].id;
                          std::variant<mir::inst::VarId,std::__cxx11::string>::
                          emplace<0ul,mir::inst::VarId>
                                    ((variant<mir::inst::VarId,std::__cxx11::string> *)(peVar3 + 1),
                                     &local_1b0);
                        }
                      }
                      if ((peVar3->dest).id == id->id) {
                        local_140 = &PTR_display_001ee058;
                        local_138 = id->id;
                        rename((char *)&local_1b0,(char *)&local_140);
                        (peVar3->dest).id = local_1b0.id;
                        local_150.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001ee058;
                        local_150.id = local_1b0.id;
                        push(&local_150);
                      }
                    }
                    else {
                      iVar5 = (*(peVar3->super_Displayable)._vptr_Displayable[1])(peVar3);
                      if (iVar5 != 7) goto LAB_001959de;
                      if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                        }
                      }
                      if ((peVar3->dest).id == id->id) {
                        local_160 = &PTR_display_001ee058;
                        local_158 = id->id;
                        rename((char *)&local_1b0,(char *)&local_160);
                        (peVar3->dest).id = local_1b0.id;
                        local_170.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001ee058;
                        local_170.id = local_1b0.id;
                        push(&local_170);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
          goto LAB_001959de;
        }
      }
      uVar20 = uVar20 + 1;
      pvVar6 = (b->inst).
               super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar23 = ((long)(b->inst).
                      super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
               -0x5555555555555555;
    } while (uVar20 <= uVar23 && uVar23 - uVar20 != 0);
  }
  ppBVar11 = (b->nextBlock).
             super__Vector_base<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((b->nextBlock).
      super__Vector_base<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppBVar11) {
    p_Var13 = &(((_Rep_type *)&local_1a0->_M_impl)->_M_impl).super__Rb_tree_header;
    uVar20 = 0;
    local_188 = b;
    do {
      p_Var16 = (((_Rep_type *)&local_1a0->_M_impl)->_M_impl).super__Rb_tree_header._M_header.
                _M_parent;
      p_Var14 = &p_Var13->_M_header;
      if (p_Var16 != (_Base_ptr)0x0) {
        iVar5 = ppBVar11[uVar20]->id;
        do {
          if (iVar5 <= (int)p_Var16[1]._M_color) {
            p_Var14 = p_Var16;
          }
          p_Var16 = (&p_Var16->_M_left)[(int)p_Var16[1]._M_color < iVar5];
        } while (p_Var16 != (_Base_ptr)0x0);
      }
      p_Var16 = &p_Var13->_M_header;
      if (((_Rb_tree_header *)p_Var14 != p_Var13) &&
         (p_Var16 = p_Var14, ppBVar11[uVar20]->id < (int)p_Var14[1]._M_color)) {
        p_Var16 = &p_Var13->_M_header;
      }
      p_Var16 = p_Var16[1]._M_parent;
      p_Var14 = p_Var16->_M_parent;
      if (p_Var16->_M_left != p_Var14) {
        lVar18 = 0;
        uVar23 = 0;
        do {
          if (*(char *)((long)&p_Var14->_M_left + lVar18) == '\0') {
            pvVar7 = std::
                     get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                               ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                 *)((long)&p_Var14->_M_color + lVar18));
            peVar3 = (pvVar7->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            p_Var22 = (pvVar7->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
            if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
              }
            }
            iVar5 = (*(peVar3->super_Displayable)._vptr_Displayable[1])(peVar3);
            if (iVar5 == 7) {
              if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                }
              }
              if (*(uint32_t *)&peVar3[1].dest.super_Displayable._vptr_Displayable == id->id) {
                local_1b0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
                local_1b0.id = V.
                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1].id;
                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                emplace_back<mir::inst::VarId>
                          ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                           &peVar3[1].dest.id,&local_1b0);
              }
              if (p_Var22 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00195b48;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
            }
            if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
            }
          }
LAB_00195b48:
          uVar23 = uVar23 + 1;
          p_Var14 = p_Var16->_M_parent;
          uVar12 = ((long)p_Var16->_M_left - (long)p_Var14 >> 3) * -0x5555555555555555;
          lVar18 = lVar18 + 0x18;
        } while (uVar23 <= uVar12 && uVar12 - uVar23 != 0);
      }
      uVar20 = uVar20 + 1;
      ppBVar11 = (local_188->nextBlock).
                 super__Vector_base<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      b = local_188;
    } while (uVar20 < (ulong)((long)(local_188->nextBlock).
                                    super__Vector_base<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar11 >> 3
                             ));
  }
  p_Var16 = (((_Rep_type *)&local_190->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_parent;
  p_Var13 = &(((_Rep_type *)&local_190->_M_impl)->_M_impl).super__Rb_tree_header;
  p_Var14 = &p_Var13->_M_header;
  if (p_Var16 != (_Base_ptr)0x0) {
    do {
      if (b->id <= (int)p_Var16[1]._M_color) {
        p_Var14 = p_Var16;
      }
      p_Var16 = (&p_Var16->_M_left)[(int)p_Var16[1]._M_color < b->id];
    } while (p_Var16 != (_Base_ptr)0x0);
  }
  p_Var16 = &p_Var13->_M_header;
  if (((_Rb_tree_header *)p_Var14 != p_Var13) &&
     (p_Var16 = p_Var14, b->id < (int)p_Var14[1]._M_color)) {
    p_Var16 = &p_Var13->_M_header;
  }
  if (((_Rb_tree_header *)p_Var16 != p_Var13) &&
     (p_Var14 = p_Var16[1]._M_parent, p_Var16[1]._M_left != p_Var14)) {
    p_Var13 = &(((_Rep_type *)&local_1a0->_M_impl)->_M_impl).super__Rb_tree_header;
    uVar20 = 0;
    do {
      p_Var17 = (local_1a0->_M_impl).super__Rb_tree_header._M_header._M_parent;
      p_Var15 = &p_Var13->_M_header;
      if (p_Var17 != (_Base_ptr)0x0) {
        do {
          if ((int)(&p_Var14->_M_color)[uVar20] <= (int)p_Var17[1]._M_color) {
            p_Var15 = p_Var17;
          }
          p_Var17 = (&p_Var17->_M_left)
                    [(int)p_Var17[1]._M_color < (int)(&p_Var14->_M_color)[uVar20]];
        } while (p_Var17 != (_Base_ptr)0x0);
      }
      p_Var17 = &p_Var13->_M_header;
      if (((_Rb_tree_header *)p_Var15 != p_Var13) &&
         (p_Var17 = p_Var15, (int)(&p_Var14->_M_color)[uVar20] < (int)p_Var15[1]._M_color)) {
        p_Var17 = &p_Var13->_M_header;
      }
      local_180.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
      local_180.id = id->id;
      b_00 = (BasicBlock *)p_Var17[1]._M_parent;
      std::
      _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
      ::_Rb_tree(&local_60,local_1a0);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::_Rb_tree(&local_90,local_190);
      rename_var(&local_180,b_00,
                 (map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  *)&local_60,
                 (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)&local_90);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_90);
      std::
      _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
      ::~_Rb_tree(&local_60);
      uVar20 = uVar20 + 1;
      p_Var14 = p_Var16[1]._M_parent;
    } while (uVar20 < (ulong)((long)p_Var16[1]._M_left - (long)p_Var14 >> 2));
  }
  uVar2 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].id;
  while (uVar2 != local_194) {
    uVar2 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
            super__Vector_impl_data._M_finish[-2].id;
    V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
    super__Vector_impl_data._M_finish =
         V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
  }
  return;
}

Assistant:

void rename_var(mir::inst::VarId id, BasicBlock* b, map<int, BasicBlock*> nodes,
                map<int, vector<int>> dom_tree) {
  mir::inst::VarId ve = top();
  for (int i = 0; i < b->inst.size(); i++) {
    if (b->inst[i].index() == 0) {
      shared_ptr<mir::inst::Inst> ins = get<0>(b->inst[i]);
      if (ins->inst_kind() == mir::inst::InstKind::Assign) {
        shared_ptr<mir::inst::AssignInst> in =
            static_pointer_cast<mir::inst::AssignInst>(ins);
        if (in->src.index() == 1) {
          mir::inst::VarId x = get<1>(in->src);
          if (x == id) {
            in->src.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Call) {
        shared_ptr<mir::inst::CallInst> in =
            static_pointer_cast<mir::inst::CallInst>(ins);
        for (int k = 0; k < in->params.size(); k++) {
          if (in->params[k].index() == 1) {
            mir::inst::VarId x = get<1>(in->params[k]);
            if (x == id) {
              in->params[k].emplace<1>(top());
            }
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Op) {
        shared_ptr<mir::inst::OpInst> in =
            static_pointer_cast<mir::inst::OpInst>(ins);
        if (in->lhs.index() == 1) {
          mir::inst::VarId x = get<1>(in->lhs);
          if (x == id) {
            in->lhs.emplace<1>(top());
          }
        }
        if (in->rhs.index() == 1) {
          mir::inst::VarId x = get<1>(in->rhs);
          if (x == id) {
            in->rhs.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Load) {
        shared_ptr<mir::inst::LoadInst> in =
            static_pointer_cast<mir::inst::LoadInst>(ins);
        if (in->src.index() == 1) {
          mir::inst::VarId x = get<1>(in->src);
          if (x == id) {
            in->src.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Store) {
        shared_ptr<mir::inst::StoreInst> in =
            static_pointer_cast<mir::inst::StoreInst>(ins);
        if (in->val.index() == 1) {
          mir::inst::VarId x = get<1>(in->val);
          if (x == id) {
            in->val.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          in->dest = top();
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::PtrOffset) {
        shared_ptr<mir::inst::PtrOffsetInst> in =
            static_pointer_cast<mir::inst::PtrOffsetInst>(ins);
        if (in->offset.index() == 1) {
          mir::inst::VarId x = get<1>(in->offset);
          if (x == id) {
            in->offset.emplace<1>(top());
          }
        }
        if (in->ptr == id) {
          in->ptr = top();
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Ref) {
        shared_ptr<mir::inst::RefInst> in =
            static_pointer_cast<mir::inst::RefInst>(ins);
        if (in->val.index() == 0) {
          mir::inst::VarId x = get<0>(in->val);
          if (x == id) {
            in->val.emplace<0>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Phi) {
        shared_ptr<mir::inst::PhiInst> in =
            static_pointer_cast<mir::inst::PhiInst>(ins);
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else {
        // nothing
      }
    } else if (b->inst[i].index() == 1) {
      shared_ptr<mir::inst::JumpInstruction> ins = get<1>(b->inst[i]);
      if (ins->kind == mir::inst::JumpInstructionKind::BrCond ||
          ins->kind == mir::inst::JumpInstructionKind::Return) {
        if (ins->cond_or_ret && ins->cond_or_ret == id) {
          ins->cond_or_ret = top();
        }
      }
    }
  }
  for (int j = 0; j < b->nextBlock.size(); j++) {
    map<int, BasicBlock*>::iterator iter = nodes.find(b->nextBlock[j]->id);
    BasicBlock* bb = iter->second;
    for (int i = 0; i < bb->inst.size(); i++) {
      if (bb->inst[i].index() == 0) {
        shared_ptr<mir::inst::Inst> ins = get<0>(bb->inst[i]);
        if (ins->inst_kind() == mir::inst::InstKind::Phi) {
          shared_ptr<mir::inst::PhiInst> in =
              static_pointer_cast<mir::inst::PhiInst>(ins);
          if (in->ori_var == id) {
            in->vars.push_back(top());
          }
        }
      }
    }
  }
  map<int, vector<int>>::iterator dtr = dom_tree.find(b->id);
  if (dtr != dom_tree.end()) {
    for (int i = 0; i < dtr->second.size(); i++) {
      map<int, BasicBlock*>::iterator it = nodes.find(dtr->second[i]);
      rename_var(id, it->second, nodes, dom_tree);
    }
  }
  while (top() != ve) {
    pop();
  }
}